

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::RgbaInputFile::readPixels(RgbaInputFile *this,int scanLine1,int scanLine2)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pointer pcVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  RgbaChannels RVar6;
  FrameBuffer *this_00;
  Slice *pSVar7;
  Header *this_01;
  Box2i *pBVar8;
  long lVar9;
  char *pcVar10;
  Rgba *pixel;
  char *pcVar11;
  int iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_50;
  
  __mutex = (pthread_mutex_t *)this->_fromYca;
  if (__mutex == (pthread_mutex_t *)0x0) {
    InputPart::readPixels(this->_inputPart,scanLine1,scanLine2);
    RVar6 = channels(this);
    if ((RVar6 & WRITE_Y) != 0) {
      this_00 = InputPart::frameBuffer(this->_inputPart);
      pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
      std::__cxx11::string::append((char *)&local_50);
      pSVar7 = FrameBuffer::findSlice(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this_01 = InputPart::header(this->_inputPart);
      pBVar8 = Header::dataWindow(this_01);
      if (scanLine1 <= scanLine2) {
        iVar5 = (pBVar8->max).x;
        iVar1 = (pBVar8->min).x;
        sVar3 = pSVar7->yStride;
        lVar9 = (long)scanLine1;
        pcVar10 = pSVar7->base + sVar3 * lVar9;
        do {
          if (iVar1 <= iVar5) {
            sVar4 = pSVar7->xStride;
            pcVar11 = pcVar10 + (long)iVar1 * sVar4;
            iVar12 = (iVar5 - iVar1) + 1;
            do {
              *(undefined2 *)(pcVar11 + 2) = *(undefined2 *)pcVar11;
              *(undefined2 *)(pcVar11 + 4) = *(undefined2 *)pcVar11;
              pcVar11 = pcVar11 + sVar4;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          lVar9 = lVar9 + 1;
          pcVar10 = pcVar10 + sVar3;
        } while (scanLine2 + 1 != (int)lVar9);
      }
    }
    return;
  }
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 == 0) {
    FromYca::readPixels(this->_fromYca,scanLine1,scanLine2);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void
RgbaInputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_fromYca)
    {
        std::lock_guard<std::mutex> lock (*_fromYca);
        _fromYca->readPixels (scanLine1, scanLine2);
    }
    else
    {
        _inputPart->readPixels (scanLine1, scanLine2);

        if (channels () & WRITE_Y)
        {
            //
            // Luma channel has been written into red channel
            // Duplicate into green and blue channel to create gray image
            //
            const Slice* s =
                _inputPart->frameBuffer ().findSlice (_channelNamePrefix + "Y");
            Box2i    dataWindow = _inputPart->header ().dataWindow ();
            intptr_t base       = reinterpret_cast<intptr_t> (s->base);

            for (int scanLine = scanLine1; scanLine <= scanLine2; scanLine++)
            {
                intptr_t rowBase = base + scanLine * s->yStride;
                for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
                {
                    Rgba* pixel =
                        reinterpret_cast<Rgba*> (rowBase + x * s->xStride);
                    pixel->g = pixel->r;
                    pixel->b = pixel->r;
                }
            }
        }
    }
}